

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

aiFace __thiscall Assimp::D3MF::XmlSerializer::ReadTriangle(XmlSerializer *this)

{
  long *plVar1;
  int iVar2;
  pointer pMVar3;
  undefined8 uVar4;
  char *pcVar5;
  uint *extraout_RDX;
  long in_RSI;
  aiFace aVar6;
  XmlSerializer *this_local;
  aiFace *face;
  
  aiFace::aiFace((aiFace *)this);
  *(undefined4 *)
   &(this->mMetaData).
    super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = 3;
  pMVar3 = (pointer)operator_new__((ulong)*(uint *)&(this->mMetaData).
                                                                                                        
                                                  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start << 2);
  (this->mMetaData).
  super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar3;
  plVar1 = *(long **)(in_RSI + 0x80);
  uVar4 = std::__cxx11::string::c_str();
  pcVar5 = (char *)(**(code **)(*plVar1 + 0x38))(plVar1,uVar4);
  iVar2 = atoi(pcVar5);
  *(int *)&((this->mMetaData).
            super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish)->name = iVar2;
  plVar1 = *(long **)(in_RSI + 0x80);
  uVar4 = std::__cxx11::string::c_str();
  pcVar5 = (char *)(**(code **)(*plVar1 + 0x38))(plVar1,uVar4);
  iVar2 = atoi(pcVar5);
  *(int *)&(((this->mMetaData).
             super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish)->name).field_0x4 = iVar2;
  plVar1 = *(long **)(in_RSI + 0x80);
  uVar4 = std::__cxx11::string::c_str();
  pcVar5 = (char *)(**(code **)(*plVar1 + 0x38))(plVar1,uVar4);
  iVar2 = atoi(pcVar5);
  *(int *)&(((this->mMetaData).
             super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish)->name)._M_string_length = iVar2;
  aVar6.mIndices = extraout_RDX;
  aVar6._0_8_ = this;
  return aVar6;
}

Assistant:

aiFace ReadTriangle() {
        aiFace face;

        face.mNumIndices = 3;
        face.mIndices = new unsigned int[face.mNumIndices];
        face.mIndices[0] = static_cast<unsigned int>(std::atoi(xmlReader->getAttributeValue(D3MF::XmlTag::v1.c_str())));
        face.mIndices[1] = static_cast<unsigned int>(std::atoi(xmlReader->getAttributeValue(D3MF::XmlTag::v2.c_str())));
        face.mIndices[2] = static_cast<unsigned int>(std::atoi(xmlReader->getAttributeValue(D3MF::XmlTag::v3.c_str())));

        return face;
    }